

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getrss.c
# Opt level: O1

size_t getCurrentRSS(void)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  size_t sVar4;
  long rss;
  long local_20;
  
  local_20 = 0;
  __stream = fopen("/proc/self/statm","r");
  if (__stream == (FILE *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    iVar2 = __isoc99_fscanf(__stream,"%*s%ld",&local_20);
    fclose(__stream);
    lVar1 = local_20;
    if (iVar2 == 1) {
      lVar3 = sysconf(0x1e);
      sVar4 = lVar3 * lVar1;
    }
  }
  return sVar4;
}

Assistant:

size_t
getCurrentRSS()
{
#if defined(__APPLE__) && defined(__MACH__)
    /* OSX ------------------------------------------------------ */
    struct mach_task_basic_info info;
    mach_msg_type_number_t infoCount = MACH_TASK_BASIC_INFO_COUNT;
    if (task_info(mach_task_self(), MACH_TASK_BASIC_INFO, (task_info_t)&info, &infoCount) != KERN_SUCCESS)
        return (size_t)0L;      /* Can't access? */
    return (size_t)info.resident_size;
#elif defined(_WIN32)
	/* Windows -------------------------------------------------- */
	PROCESS_MEMORY_COUNTERS info;
	GetProcessMemoryInfo( GetCurrentProcess( ), &info, sizeof(info) );
	return (size_t)info.WorkingSetSize;
#else
    /* Linux ---------------------------------------------------- */
    long rss = 0L;
    FILE *fp = NULL;
    if ((fp = fopen("/proc/self/statm", "r")) == NULL)
        return (size_t)0L;      /* Can't open? */
    if (fscanf(fp, "%*s%ld", &rss) != 1) {
        fclose(fp);
        return (size_t)0L;      /* Can't read? */
    }
    fclose(fp);
    return (size_t)rss * (size_t)sysconf(_SC_PAGESIZE);
#endif
}